

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.cpp
# Opt level: O0

void __thiscall
antlr::MismatchedTokenException::MismatchedTokenException
          (MismatchedTokenException *this,char **tokenNames_,int numTokens_,RefToken *token_,
          int lower,int upper_,bool matchNot,string *fileName_)

{
  int iVar1;
  Token *pTVar2;
  RecognitionException *this_00;
  undefined8 *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  byte in_stack_00000008;
  TokenRefCount<antlr::Token> *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  TokenRefCount<antlr::Token> *this_01;
  undefined4 in_stack_ffffffffffffff58;
  allocator<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  BitSet *this_02;
  undefined1 local_51 [40];
  byte local_29;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_14;
  undefined8 local_10;
  
  local_29 = in_stack_00000008 & 1;
  this_02 = (BitSet *)local_51;
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RCX,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  pTVar2 = TokenRefCount<antlr::Token>::operator->((TokenRefCount<antlr::Token> *)in_RCX);
  (*pTVar2->_vptr_Token[3])();
  this_00 = (RecognitionException *)
            TokenRefCount<antlr::Token>::operator->((TokenRefCount<antlr::Token> *)in_RCX);
  iVar1 = (*(this_00->super_ANTLRException)._vptr_ANTLRException[2])();
  RecognitionException::RecognitionException
            (this_00,(string *)CONCAT44(iVar1,in_stack_ffffffffffffff58),in_stack_ffffffffffffff50,
             (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),(int)in_stack_ffffffffffffff48);
  std::__cxx11::string::~string((string *)(local_51 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_51);
  *in_RDI = &PTR__MismatchedTokenException_0033ee38;
  this_01 = (TokenRefCount<antlr::Token> *)(in_RDI + 10);
  TokenRefCount<antlr::Token>::TokenRefCount(this_01,in_stack_ffffffffffffff48);
  ASTRefCount<antlr::AST>::ASTRefCount((ASTRefCount<antlr::AST> *)this_01,(AST *)(in_RDI + 0xb));
  puVar3 = in_RDI + 0xc;
  pTVar2 = TokenRefCount<antlr::Token>::operator->((TokenRefCount<antlr::Token> *)in_RCX);
  (*pTVar2->_vptr_Token[4])(puVar3);
  *(uint *)(in_RDI + 0x10) = (local_29 & 1) + 3;
  *(undefined4 *)((long)in_RDI + 0x84) = local_24;
  *(undefined4 *)(in_RDI + 0x11) = local_28;
  BitSet::BitSet(this_02,(uint)((ulong)in_RDI >> 0x20));
  in_RDI[0x17] = local_10;
  *(undefined4 *)(in_RDI + 0x18) = local_14;
  return;
}

Assistant:

MismatchedTokenException::MismatchedTokenException(
	const char* const* tokenNames_,
	const int numTokens_,
	RefToken token_,
	int lower,
	int upper_,
	bool matchNot,
	const ANTLR_USE_NAMESPACE(std)string& fileName_
) : RecognitionException("Mismatched Token",fileName_,token_->getLine(),token_->getColumn())
  , token(token_)
  , node(nullASTptr)
  , tokenText(token_->getText())
  , mismatchType(matchNot ? NOT_RANGE : RANGE)
  , expecting(lower)
  , upper(upper_)
  , tokenNames(tokenNames_)
  , numTokens(numTokens_)
{
}